

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O0

void __thiscall kj::Thread::Thread(Thread *this,Function<void_()> *func)

{
  ThreadState *this_00;
  Function<void_()> *pFVar1;
  Fault local_48;
  Fault f;
  int pthreadResult;
  Function<void_()> local_28;
  Function<void_()> *local_18;
  Function<void_()> *func_local;
  Thread *this_local;
  
  local_18 = func;
  func_local = (Function<void_()> *)this;
  this_00 = (ThreadState *)operator_new(0x188);
  pFVar1 = mv<kj::Function<void()>>(func);
  Function<void_()>::Function(&local_28,pFVar1);
  ThreadState::ThreadState(this_00,&local_28);
  Function<void_()>::~Function(&local_28);
  this->state = this_00;
  this->detached = false;
  f.exception._4_4_ = pthread_create(&this->threadId,(pthread_attr_t *)0x0,runThread,this->state);
  if (f.exception._4_4_ != 0) {
    ThreadState::unref(this->state);
    kj::_::Debug::Fault::Fault
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/thread.c++"
               ,0x4a,f.exception._4_4_,"pthread_create","");
    kj::_::Debug::Fault::fatal(&local_48);
  }
  return;
}

Assistant:

Thread::Thread(Function<void()> func): state(new ThreadState(kj::mv(func))) {
  static_assert(sizeof(threadId) >= sizeof(pthread_t),
                "pthread_t is larger than a long long on your platform.  Please port.");

  int pthreadResult = pthread_create(reinterpret_cast<pthread_t*>(&threadId),
                                     nullptr, &runThread, state);
  if (pthreadResult != 0) {
    state->unref();
    KJ_FAIL_SYSCALL("pthread_create", pthreadResult);
  }
}